

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O3

void __thiscall Network::remove_link(Network *this,uint node_i,uint node_j)

{
  pointer psVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var5;
  bool bVar6;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar7;
  uint local_20;
  uint local_1c;
  
  psVar1 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = *(_Base_ptr *)((long)&psVar1[node_i]._M_t._M_impl.super__Rb_tree_header + 8);
  local_20 = node_j;
  local_1c = node_i;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var4 = &psVar1[node_i]._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var4;
    do {
      bVar6 = p_Var2[1]._M_color < node_j;
      if (!bVar6) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar6];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var3 != p_Var4) && (p_Var3[1]._M_color <= node_j)) {
      update_triangles(this,node_i,node_j,false);
      p_Var5 = &(this->links).
                super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[node_i]._M_t;
      pVar7 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(p_Var5,&local_20);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(p_Var5,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
      p_Var5 = &(this->links).
                super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_20]._M_t;
      pVar7 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(p_Var5,&local_1c);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(p_Var5,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
      return;
    }
  }
  __assert_fail("links[node_i].count(node_j) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                ,0xb9,"void Network::remove_link(unsigned int, unsigned int)");
}

Assistant:

void remove_link(unsigned int node_i, unsigned int node_j) {
        assert(links[node_i].count(node_j) == 1);  // link must exist

        update_triangles(node_i, node_j, false);

        links[node_i].erase(node_j);
        links[node_j].erase(node_i);
    }